

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  byte *in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  int iVar4;
  
  if ((*in_RDI & 1) != 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x6dc,"ClearInputData","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0x60); iVar4 = iVar4 + 1) {
    pIVar1 = ImVector<ImFontConfig>::operator[]
                       ((ImVector<ImFontConfig> *)CONCAT44(iVar4,in_stack_fffffffffffffff0),
                        (int)((ulong)in_RDI >> 0x20));
    if (pIVar1->FontData != (void *)0x0) {
      pIVar1 = ImVector<ImFontConfig>::operator[]
                         ((ImVector<ImFontConfig> *)CONCAT44(iVar4,in_stack_fffffffffffffff0),
                          (int)((ulong)in_RDI >> 0x20));
      if ((pIVar1->FontDataOwnedByAtlas & 1U) != 0) {
        ImVector<ImFontConfig>::operator[]
                  ((ImVector<ImFontConfig> *)CONCAT44(iVar4,in_stack_fffffffffffffff0),
                   (int)((ulong)in_RDI >> 0x20));
        ImGui::MemFree((void *)CONCAT44(iVar4,in_stack_fffffffffffffff0));
        pIVar1 = ImVector<ImFontConfig>::operator[]
                           ((ImVector<ImFontConfig> *)CONCAT44(iVar4,in_stack_fffffffffffffff0),
                            (int)((ulong)in_RDI >> 0x20));
        pIVar1->FontData = (void *)0x0;
      }
    }
  }
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x40); iVar3 = iVar3 + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[]
                        ((ImVector<ImFont_*> *)CONCAT44(iVar4,iVar3),(int)((ulong)in_RDI >> 0x20));
    if (*(ImFontConfig **)(in_RDI + 0x68) <= (*ppIVar2)->ConfigData) {
      ppIVar2 = ImVector<ImFont_*>::operator[]
                          ((ImVector<ImFont_*> *)CONCAT44(iVar4,iVar3),(int)((ulong)in_RDI >> 0x20))
      ;
      if ((*ppIVar2)->ConfigData <
          (ImFontConfig *)(*(long *)(in_RDI + 0x68) + (long)*(int *)(in_RDI + 0x60) * 0x88)) {
        ppIVar2 = ImVector<ImFont_*>::operator[]
                            ((ImVector<ImFont_*> *)CONCAT44(iVar4,iVar3),
                             (int)((ulong)in_RDI >> 0x20));
        (*ppIVar2)->ConfigData = (ImFontConfig *)0x0;
        ppIVar2 = ImVector<ImFont_*>::operator[]
                            ((ImVector<ImFont_*> *)CONCAT44(iVar4,iVar3),
                             (int)((ulong)in_RDI >> 0x20));
        (*ppIVar2)->ConfigDataCount = 0;
      }
    }
  }
  ImVector<ImFontConfig>::clear((ImVector<ImFontConfig> *)CONCAT44(iVar4,iVar3));
  ImVector<ImFontAtlasCustomRect>::clear((ImVector<ImFontAtlasCustomRect> *)CONCAT44(iVar4,iVar3));
  in_RDI[0x474] = 0xff;
  in_RDI[0x475] = 0xff;
  in_RDI[0x476] = 0xff;
  in_RDI[0x477] = 0xff;
  in_RDI[0x470] = 0xff;
  in_RDI[0x471] = 0xff;
  in_RDI[0x472] = 0xff;
  in_RDI[0x473] = 0xff;
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    PackIdMouseCursors = PackIdLines = -1;
}